

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildUnaryOp(int nToken,CNscPStackEntry *pValue)

{
  bool bVar1;
  NscType NVar2;
  CNscContext *this;
  CNscPStackEntry *in_RSI;
  int in_EDI;
  NscType nType;
  CNscPStackEntry *pOut;
  CNscContext *in_stack_ffffffffffffffb8;
  CNscContext *in_stack_ffffffffffffffc0;
  CNscPStackEntry *in_stack_ffffffffffffffc8;
  CNscContext *pCVar3;
  CNscPStackEntry *in_stack_ffffffffffffffd0;
  
  this = (CNscContext *)
         CNscContext::GetPStackEntry(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,0);
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) {
    if (in_RSI == (CNscPStackEntry *)0x0) {
      __assert_fail("pValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0xa76,"CNscPStackEntry *NscBuildUnaryOp(int, CNscPStackEntry *)");
    }
    NVar2 = CNscPStackEntry::GetType(in_RSI);
    if (NVar2 == NscType_Error) {
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                 (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    }
    else if (in_EDI == 0x21) {
      if (NVar2 == NscType_Integer) {
        bVar1 = CNscContext::GetOptExpression(g_pCtx);
        if ((bVar1) &&
           (bVar1 = CNscPStackEntry::IsSimpleConstant((CNscPStackEntry *)0x1ffcac), bVar1)) {
          in_stack_ffffffffffffffb8 = this;
          CNscPStackEntry::GetInteger((CNscPStackEntry *)in_stack_ffffffffffffffc0);
          CNscPStackEntry::PushConstantInteger
                    (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                     (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        }
        else {
          CNscPStackEntry::AppendData(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          CNscPStackEntry::PushSimpleOp
                    (in_stack_ffffffffffffffd0,(NscPCode)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (NscType)in_stack_ffffffffffffffc8);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                     (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        }
      }
      else {
        CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,"!");
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                   (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      }
    }
    else if (in_EDI == 0x2b) {
      if ((NVar2 == NscType_Integer) || (NVar2 == NscType_Float)) {
        CNscPStackEntry::AppendData(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                   (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      }
      else {
        CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,"+");
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                   (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      }
    }
    else if (in_EDI == 0x2d) {
      if (NVar2 == NscType_Integer) {
        bVar1 = CNscContext::GetOptExpression(g_pCtx);
        if ((bVar1) &&
           (bVar1 = CNscPStackEntry::IsSimpleConstant((CNscPStackEntry *)0x1ffa7f), bVar1)) {
          pCVar3 = this;
          CNscPStackEntry::GetInteger((CNscPStackEntry *)in_stack_ffffffffffffffc0);
          CNscPStackEntry::PushConstantInteger
                    ((CNscPStackEntry *)pCVar3,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                     (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        }
        else {
          CNscPStackEntry::AppendData(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          CNscPStackEntry::PushSimpleOp
                    (in_stack_ffffffffffffffd0,(NscPCode)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (NscType)in_stack_ffffffffffffffc8);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                     (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        }
      }
      else if (NVar2 == NscType_Float) {
        bVar1 = CNscContext::GetOptExpression(g_pCtx);
        if ((bVar1) &&
           (bVar1 = CNscPStackEntry::IsSimpleConstant((CNscPStackEntry *)0x1ffb16), bVar1)) {
          pCVar3 = this;
          CNscPStackEntry::GetFloat((CNscPStackEntry *)in_stack_ffffffffffffffc0);
          CNscPStackEntry::PushConstantFloat
                    (in_stack_ffffffffffffffd0,(float)((ulong)pCVar3 >> 0x20));
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                     (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        }
        else {
          CNscPStackEntry::AppendData(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          CNscPStackEntry::PushSimpleOp
                    (in_stack_ffffffffffffffd0,(NscPCode)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (NscType)in_stack_ffffffffffffffc8);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                     (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        }
      }
      else {
        CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,"-");
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                   (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      }
    }
    else {
      if (in_EDI != 0x7e) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                      ,0xaf1,"CNscPStackEntry *NscBuildUnaryOp(int, CNscPStackEntry *)");
      }
      if (NVar2 == NscType_Integer) {
        bVar1 = CNscContext::GetOptExpression(g_pCtx);
        if ((bVar1) &&
           (bVar1 = CNscPStackEntry::IsSimpleConstant((CNscPStackEntry *)0x1ffbe6), bVar1)) {
          in_stack_ffffffffffffffc0 = this;
          CNscPStackEntry::GetInteger((CNscPStackEntry *)this);
          CNscPStackEntry::PushConstantInteger
                    (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                     (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        }
        else {
          CNscPStackEntry::AppendData(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          CNscPStackEntry::PushSimpleOp
                    (in_stack_ffffffffffffffd0,(NscPCode)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (NscType)in_stack_ffffffffffffffc8);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                     (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        }
      }
      else {
        CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,"~");
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
                   (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      }
    }
    CNscContext::FreePStackEntry
              (in_stack_ffffffffffffffc0,(CNscPStackEntry *)in_stack_ffffffffffffffb8);
  }
  else {
    if (in_RSI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_ffffffffffffffc0,(CNscPStackEntry *)in_stack_ffffffffffffffb8);
    }
    CNscPStackEntry::SetType
              ((CNscPStackEntry *)in_stack_ffffffffffffffc0,
               (NscType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  }
  return (CNscPStackEntry *)this;
}

Assistant:

YYSTYPE NscBuildUnaryOp (int nToken, YYSTYPE pValue)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pValue)
			g_pCtx ->FreePStackEntry (pValue);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Get the value
	//

	assert (pValue);

	//
	// Check for an error
	//

	NscType nType = pValue ->GetType ();
	if (nType == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Process the operator
	//

	else
	{
		switch (nToken)
		{
			case '+': //BIOWARE - Not supported by their compiler
				if (nType == NscType_Integer || 
					nType == NscType_Float)
				{
					pOut ->AppendData (pValue);
					pOut ->SetType (nType);
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "+");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '-':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							- pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_Negate, nType);
						pOut ->SetType (nType);
					}
				}
				else if (nType == NscType_Float)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantFloat (
							- pValue ->GetFloat ());
						pOut ->SetType (nType);
				}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_Negate, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "-");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '~':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							~ pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_BitwiseNot, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "~");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '!':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							! pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_LogicalNot, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "!");
					pOut ->SetType (NscType_Error);
				}
				break;

			default:
				assert (false);
				g_pCtx ->GenerateMessage (NscMessage_ErrorInternalCompilerError,
					"invalid unary operator");
				pOut ->SetType (NscType_Error);
				break;
		}
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pValue);
	return pOut;
}